

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_attr_set_keycode(exr_context_t ctxt,int part_index,char *name,exr_attr_keycode_t *val)

{
  pthread_mutex_t *__mutex;
  exr_attr_m33d_t *peVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  exr_result_t eVar5;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  char *pcVar6;
  exr_context_t nonc;
  char *pcVar7;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_38;
  
  local_38 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar5 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar5;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar5 = 0x15;
LAB_001219ee:
    eVar5 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar5);
    return eVar5;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar5 = 8;
    goto LAB_001219ee;
  }
  list = &ctxt->parts[(uint)part_index]->attributes;
  eVar5 = exr_attr_list_find_by_name(ctxt,list,name,&local_38);
  if (eVar5 == 0) {
    eVar5 = 0;
    if (local_38->type == EXR_ATTR_KEYCODE) goto LAB_00121a71;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    pcVar7 = local_38->type_name;
    pcVar6 = "\'%s\' requested type \'keycode\', but stored attributes is type \'%s\'";
    eVar5 = 0x10;
LAB_00121ae2:
    eVar5 = (*ctxt->print_error)(ctxt,eVar5,pcVar6,name,pcVar7);
  }
  else {
    if (eVar5 == 0xf) {
      if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return 0xf;
      }
      eVar5 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_KEYCODE,0,(uint8_t **)0x0,&local_38);
LAB_00121a71:
      if (val == (exr_attr_keycode_t *)0x0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        pcVar6 = "No input value for setting \'%s\', type \'%s\'";
        pcVar7 = "keycode";
        eVar5 = 3;
        goto LAB_00121ae2;
      }
      if (eVar5 == 0) {
        peVar1 = (local_38->field_6).m33d;
        dVar2 = *(double *)val;
        dVar3 = *(double *)&val->prefix;
        uVar4 = *(undefined8 *)&val->perfs_per_frame;
        *(undefined8 *)((long)peVar1->m + 0xc) = *(undefined8 *)&val->count;
        *(undefined8 *)((long)peVar1->m + 0x14) = uVar4;
        peVar1->m[0] = dVar2;
        peVar1->m[1] = dVar3;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return eVar5;
}

Assistant:

exr_result_t
exr_attr_set_keycode (
    exr_context_t             ctxt,
    int                       part_index,
    const char*               name,
    const exr_attr_keycode_t* val)
{
    ATTR_SET_IMPL_DEREF (EXR_ATTR_KEYCODE, keycode);
}